

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::printSummaryRow
          (anon_unknown_26 *this,ostream *stream,ColourImpl *colour,StringRef label,
          vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
          *cols,size_t row)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  char *pcVar4;
  char *pcVar5;
  Code colourCode;
  StringRef str;
  ColourGuard local_b8;
  ColourGuard local_a8 [2];
  ColourGuard local_88;
  ColourImpl *local_78;
  char *local_70;
  string *local_68;
  string *suffix;
  string *value;
  SummaryColumn *col;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
  *__range2;
  size_t row_local;
  vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
  *cols_local;
  ColourImpl *colour_local;
  ostream *stream_local;
  StringRef label_local;
  
  pcVar4 = label.m_start;
  pcVar5 = pcVar4;
  __end2 = std::
           vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
           ::begin((vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                    *)label.m_size);
  col = (SummaryColumn *)
        std::
        vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
        ::end((vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
               *)label.m_size);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_Catch::(anonymous_namespace)::SummaryColumn_*,_std::vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>_>
                                     *)&col), bVar1) {
    value = &__gnu_cxx::
             __normal_iterator<const_Catch::(anonymous_namespace)::SummaryColumn_*,_std::vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>_>
             ::operator*(&__end2)->m_suffix;
    suffix = (anonymous_namespace)::SummaryColumn::getRow_abi_cxx11_
                       ((SummaryColumn *)value,(size_t)cols);
    local_68 = (anonymous_namespace)::SummaryColumn::getSuffix_abi_cxx11_((SummaryColumn *)value);
    uVar2 = std::__cxx11::string::empty();
    colourCode = (Code)stream;
    if ((uVar2 & 1) == 0) {
      bVar1 = std::operator!=(suffix,"0");
      if (bVar1) {
        ColourImpl::guardColour((ColourImpl *)local_a8,colourCode);
        poVar3 = Catch::operator<<((ostream *)this,local_a8);
        poVar3 = std::operator<<(poVar3," | ");
        SummaryColumn::getColour((SummaryColumn *)value);
        ColourImpl::guardColour((ColourImpl *)&local_b8,colourCode);
        poVar3 = Catch::operator<<(poVar3,&local_b8);
        poVar3 = std::operator<<(poVar3,(string *)suffix);
        poVar3 = std::operator<<(poVar3,' ');
        std::operator<<(poVar3,(string *)local_68);
        ColourImpl::ColourGuard::~ColourGuard(&local_b8);
        ColourImpl::ColourGuard::~ColourGuard(local_a8);
      }
    }
    else {
      str.m_size = (size_type)pcVar5;
      str.m_start = pcVar4;
      local_78 = colour;
      local_70 = pcVar4;
      poVar3 = Catch::operator<<((Catch *)this,(ostream *)colour,str);
      std::operator<<(poVar3,": ");
      bVar1 = std::operator!=(suffix,"0");
      if (bVar1) {
        std::operator<<((ostream *)this,(string *)suffix);
      }
      else {
        ColourImpl::guardColour((ColourImpl *)&local_88,colourCode);
        poVar3 = Catch::operator<<((ostream *)this,&local_88);
        std::operator<<(poVar3,"- none -");
        ColourImpl::ColourGuard::~ColourGuard(&local_88);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::(anonymous_namespace)::SummaryColumn_*,_std::vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>_>
    ::operator++(&__end2);
  }
  std::operator<<((ostream *)this,'\n');
  return;
}

Assistant:

void printSummaryRow( std::ostream& stream,
                              ColourImpl& colour,
                              StringRef label,
                              std::vector<SummaryColumn> const& cols,
                              std::size_t row ) {
            for ( auto const& col : cols ) {
                auto const& value = col.getRow( row );
                auto const& suffix = col.getSuffix();
                if ( suffix.empty() ) {
                    stream << label << ": ";
                    if ( value != "0" ) {
                        stream << value;
                    } else {
                        stream << colour.guardColour( Colour::Warning )
                               << "- none -";
                    }
                } else if ( value != "0" ) {
                    stream << colour.guardColour( Colour::LightGrey ) << " | "
                           << colour.guardColour( col.getColour() ) << value
                           << ' ' << suffix;
                }
            }
            stream << '\n';
        }